

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * setVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  mapped_type *this;
  Hcell *pHVar1;
  mapped_type *this_00;
  Hcell local_50;
  Machine *local_20;
  Machine *m_local;
  Machine *pMStack_10;
  Register r_local;
  
  local_20 = m;
  m_local._4_4_ = r.r;
  pMStack_10 = __return_storage_ptr__;
  Hcell::ref(&local_50,(Hix)(m->h).hix);
  this = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
         operator[](&m->heap,&m->h);
  pHVar1 = Hcell::operator=(this,&local_50);
  this_00 = std::
            map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
            ::operator[](&m->regval,(key_type *)((long)&m_local + 4));
  Hcell::operator=(this_00,pHVar1);
  Hcell::~Hcell(&local_50);
  Hix::operator+=(&m->h,1);
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine setVariable(Machine m, Register r) {
    m.regval[r] = m.heap[m.h] = Hcell::ref(m.h);
    m.h += 1;
    return m;
}